

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O0

void init_proc_440EP(CPUPPCState_conflict2 *env)

{
  PowerPCCPU_conflict3 *cpu;
  CPUPPCState_conflict2 *env_local;
  
  gen_tbl(env);
  gen_spr_BookE(env,0xffff);
  gen_spr_440(env);
  gen_spr_usprgh(env);
  _spr_register(env,0x11e,"PIR",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_pir,
                spr_read_generic,spr_write_pir,0);
  _spr_register(env,0x13a,"IAC3",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x13b,"IAC4",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x13e,"DVC1",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x13f,"DVC2",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x23c,"MCSR",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x23a,"MCSRR0",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x23b,"MCSRR1",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x378,"CCR1",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  env->nb_tlb = 0x40;
  env->nb_ways = 1;
  env->id_tlbs = 0;
  env->tlb_type = 2;
  init_excp_BookE(env);
  env->dcache_line_size = 0x20;
  env->icache_line_size = 0x20;
  cpu = (PowerPCCPU_conflict3 *)env_archcpu((CPUArchState_conflict22 *)env);
  ppc40x_irq_init_ppc64(cpu);
  builtin_memcpy(env->fit_period,"\f\x10\x14\x18",4);
  builtin_memcpy(env->wdt_period,"\x14\x18\x1c ",4);
  return;
}

Assistant:

static void init_proc_440EP(CPUPPCState *env)
{
    /* Time base */
    gen_tbl(env);
    gen_spr_BookE(env, 0x000000000000FFFFULL);
    gen_spr_440(env);
    gen_spr_usprgh(env);
    /* Processor identification */
    spr_register(env, SPR_BOOKE_PIR, "PIR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_pir,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_BOOKE_IAC3, "IAC3",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_BOOKE_IAC4, "IAC4",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_BOOKE_DVC1, "DVC1",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_BOOKE_DVC2, "DVC2",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_BOOKE_MCSR, "MCSR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    spr_register(env, SPR_BOOKE_MCSRR0, "MCSRR0",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    spr_register(env, SPR_BOOKE_MCSRR1, "MCSRR1",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_440_CCR1, "CCR1",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* Memory management */
    env->nb_tlb = 64;
    env->nb_ways = 1;
    env->id_tlbs = 0;
    env->tlb_type = TLB_EMB;

    init_excp_BookE(env);
    env->dcache_line_size = 32;
    env->icache_line_size = 32;
    ppc40x_irq_init(env_archcpu(env));

    SET_FIT_PERIOD(12, 16, 20, 24);
    SET_WDT_PERIOD(20, 24, 28, 32);
}